

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_object_list_resize_hash(JSContext *ctx,JSObjectList *s,uint32_t new_hash_size)

{
  uint32_t uVar1;
  list_head *ptr;
  undefined8 *puVar2;
  undefined4 in_EDX;
  JSContext *in_RSI;
  uint32_t *new_hash_table;
  uint32_t h;
  uint32_t i;
  JSObjectListEntry *e;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  ptr = (list_head *)js_malloc(in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  if (ptr == (list_head *)0x0) {
    local_4 = -1;
  }
  else {
    js_free((JSContext *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),ptr);
    (in_RSI->header).link.next = ptr;
    *(undefined4 *)&in_RSI->rt = in_EDX;
    for (uVar3 = 0; uVar3 < *(uint *)&in_RSI->rt; uVar3 = uVar3 + 1) {
      *(undefined4 *)((long)&((in_RSI->header).link.next)->prev + (ulong)uVar3 * 4) = 0xffffffff;
    }
    for (uVar3 = 0; uVar3 < *(uint *)&(in_RSI->header).link.prev; uVar3 = uVar3 + 1) {
      puVar2 = (undefined8 *)(*(long *)&in_RSI->header + (ulong)uVar3 * 0x10);
      uVar1 = js_object_list_get_hash((JSObject *)*puVar2,*(uint32_t *)&in_RSI->rt);
      *(undefined4 *)(puVar2 + 1) =
           *(undefined4 *)((long)&((in_RSI->header).link.next)->prev + (ulong)uVar1 * 4);
      *(uint *)((long)&((in_RSI->header).link.next)->prev + (ulong)uVar1 * 4) = uVar3;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int js_object_list_resize_hash(JSContext *ctx, JSObjectList *s,
                                 uint32_t new_hash_size)
{
    JSObjectListEntry *e;
    uint32_t i, h, *new_hash_table;

    new_hash_table = js_malloc(ctx, sizeof(new_hash_table[0]) * new_hash_size);
    if (!new_hash_table)
        return -1;
    js_free(ctx, s->hash_table);
    s->hash_table = new_hash_table;
    s->hash_size = new_hash_size;
    
    for(i = 0; i < s->hash_size; i++) {
        s->hash_table[i] = -1;
    }
    for(i = 0; i < s->object_count; i++) {
        e = &s->object_tab[i];
        h = js_object_list_get_hash(e->obj, s->hash_size); 
        e->hash_next = s->hash_table[h];
        s->hash_table[h] = i;
    }
    return 0;
}